

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O3

int __thiscall rcg::Stream::open(Stream *this,char *__file,int __oflag,...)

{
  PDevOpenDataStream p_Var1;
  int iVar2;
  GC_ERROR GVar3;
  void *pvVar4;
  GenTLException *pGVar5;
  string local_48;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar2 == 0) {
    iVar2 = this->n_open;
    if (iVar2 == 0) {
      pvVar4 = Device::getHandle((this->parent).
                                 super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if (pvVar4 == (void *)0x0) goto LAB_00110a52;
      p_Var1 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               DevOpenDataStream;
      pvVar4 = Device::getHandle((this->parent).
                                 super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      GVar3 = (*p_Var1)(pvVar4,(this->id)._M_dataplus._M_p,&this->stream);
      if (GVar3 != 0) {
        pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Stream::open()","");
        GenTLException::GenTLException(pGVar5,&local_48,&this->gentl);
        __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      iVar2 = this->n_open;
    }
    this->n_open = iVar2 + 1;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return iVar2;
  }
  std::__throw_system_error(iVar2);
LAB_00110a52:
  pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Stream::open(): Device must be opened before open before opening a stream","");
  GenTLException::GenTLException(pGVar5,&local_48);
  __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void Stream::open()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open == 0)
  {
    if (parent->getHandle() != 0)
    {
      if (gentl->DevOpenDataStream(parent->getHandle(), id.c_str(), &stream) !=
          GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("Stream::open()", gentl);
      }
    }
    else
    {
      throw GenTLException("Stream::open(): Device must be opened before open before opening a stream");
    }
  }

  n_open++;
}